

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

Own<const_kj::FsNode> __thiscall
kj::anon_unknown_35::AppendableFileImpl::cloneFsNode(AppendableFileImpl *this)

{
  int in_ECX;
  void *in_RDX;
  FsNode *extraout_RDX;
  long in_RSI;
  void *in_R8;
  Own<const_kj::FsNode> OVar1;
  Own<const_kj::File> OStack_38;
  Own<kj::(anonymous_namespace)::AppendableFileImpl> local_28;
  
  File::clone((File *)&OStack_38,*(__fn **)(in_RSI + 0x18),in_RDX,in_ECX,in_R8);
  heap<kj::(anonymous_namespace)::AppendableFileImpl,kj::Own<kj::File_const>>
            ((kj *)&local_28,&OStack_38);
  (this->super_AppendableFile).super_FsNode._vptr_FsNode = (_func_int **)local_28.disposer;
  (this->super_AppendableFile).super_OutputStream._vptr_OutputStream = (_func_int **)local_28.ptr;
  local_28.ptr = (AppendableFileImpl *)0x0;
  Own<kj::(anonymous_namespace)::AppendableFileImpl>::~Own(&local_28);
  Own<const_kj::File>::dispose(&OStack_38);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Own<const FsNode> cloneFsNode() const override {
    return heap<AppendableFileImpl>(file->clone());
  }